

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

void __thiscall amrex::ClusterList::boxList(ClusterList *this,BoxList *blst)

{
  bool bVar1;
  reference ppCVar2;
  BoxList *in_RSI;
  const_iterator End;
  const_iterator cli;
  list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *in_stack_ffffffffffffffc8;
  BoxList *bn;
  BoxList *this_00;
  _Self local_20;
  _Self local_18;
  BoxList *local_10;
  
  local_10 = in_RSI;
  BoxList::clear((BoxList *)0x1643522);
  this_00 = local_10;
  std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::size
            ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)local_10);
  BoxList::reserve(this_00,(size_t)in_stack_ffffffffffffffc8);
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::end
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    bn = local_10;
    ppCVar2 = std::_List_const_iterator<amrex::Cluster_*>::operator*
                        ((_List_const_iterator<amrex::Cluster_*> *)this_00);
    Cluster::box(*ppCVar2);
    BoxList::push_back(this_00,(Box *)bn);
    std::_List_const_iterator<amrex::Cluster_*>::operator++(&local_18);
  }
  return;
}

Assistant:

void
ClusterList::boxList (BoxList& blst) const
{
    blst.clear();
    blst.reserve(lst.size());
    for (std::list<Cluster*>::const_iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli)
    {
        blst.push_back((*cli)->box());
    }
}